

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy.h
# Opt level: O1

int64_t __thiscall
disruptor::SingleThreadedStrategy::IncrementAndGet
          (SingleThreadedStrategy *this,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          size_t delta)

{
  pointer ppSVar1;
  long lVar2;
  pointer ppSVar3;
  long lVar4;
  long lVar5;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *__range1;
  long lVar6;
  
  lVar5 = delta + this->last_claimed_sequence_;
  this->last_claimed_sequence_ = lVar5;
  lVar6 = lVar5 - this->buffer_size_;
  if (this->last_consumer_sequence_ < lVar6) {
    while( true ) {
      ppSVar3 = (dependents->
                super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppSVar1 = (dependents->
                super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      lVar4 = 0x7fffffffffffffff;
      if (ppSVar3 != ppSVar1) {
        lVar4 = 0x7fffffffffffffff;
        do {
          lVar2 = ((*ppSVar3)->sequence_).super___atomic_base<long>._M_i;
          if (lVar2 <= lVar4) {
            lVar4 = lVar2;
          }
          ppSVar3 = ppSVar3 + 1;
        } while (ppSVar3 != ppSVar1);
      }
      if (lVar6 <= lVar4) break;
      sched_yield();
    }
  }
  return lVar5;
}

Assistant:

int64_t IncrementAndGet(Sequence& cursor,
                          const std::vector<Sequence*>& dependents,
                          size_t delta = 1) {
    const int64_t next_sequence = (last_claimed_sequence_ += delta);
    const int64_t wrap_point = next_sequence - buffer_size_;
    if (last_consumer_sequence_ < wrap_point) {
      while (GetMinimumSequence(dependents) < wrap_point) {
        // TODO: configurable yield strategy
        std::this_thread::yield();
      }
    }
    return next_sequence;
  }